

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O2

int4 __thiscall
PcodeInjectLibrarySleigh::manualCallOtherFixup
          (PcodeInjectLibrarySleigh *this,string *name,string *outname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inname,string *snippet)

{
  InjectPayload *this_00;
  pointer pbVar1;
  uint uVar2;
  int4 i;
  ulong uVar3;
  long lVar4;
  InjectParameter local_78;
  string sourceName;
  
  std::operator+(&local_78.name,"<manual callotherfixup name=\"",name);
  std::operator+(&sourceName,&local_78.name,"\")");
  std::__cxx11::string::~string((string *)&local_78);
  uVar2 = (**(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary)(this,&sourceName,name,2);
  this_00 = (this->super_PcodeInjectLibrary).injection.
            super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar2];
  lVar4 = 0;
  for (uVar3 = 0;
      pbVar1 = (inname->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(inname->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar3 = uVar3 + 1) {
    InjectParameter::InjectParameter
              (&local_78,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4),0);
    std::vector<InjectParameter,_std::allocator<InjectParameter>_>::emplace_back<InjectParameter>
              (&this_00->inputlist,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    lVar4 = lVar4 + 0x20;
  }
  if (outname->_M_string_length != 0) {
    InjectParameter::InjectParameter(&local_78,outname,0);
    std::vector<InjectParameter,_std::allocator<InjectParameter>_>::emplace_back<InjectParameter>
              (&this_00->output,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  InjectPayload::orderParameters(this_00);
  std::__cxx11::string::_M_assign((string *)&this_00[1].name);
  (*(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary[1])(this,(ulong)uVar2);
  std::__cxx11::string::~string((string *)&sourceName);
  return uVar2;
}

Assistant:

int4 PcodeInjectLibrarySleigh::manualCallOtherFixup(const string &name,const string &outname,
						    const vector<string> &inname,const string &snippet)
{
  string sourceName = "<manual callotherfixup name=\"" + name + "\")";
  int4 injectid = allocateInject(sourceName, name, InjectPayload::CALLOTHERFIXUP_TYPE);
  InjectPayloadSleigh *payload = (InjectPayloadSleigh *)getPayload(injectid);
  for(int4 i=0;i<inname.size();++i)
    payload->inputlist.push_back(InjectParameter(inname[i],0));
  if (outname.size() != 0)
    payload->output.push_back(InjectParameter(outname,0));
  payload->orderParameters();
  payload->parsestring = snippet;
  registerInject(injectid);
  return injectid;
}